

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.h
# Opt level: O1

void __thiscall sptk::ScalarOperation::~ScalarOperation(ScalarOperation *this)

{
  pointer ppMVar1;
  
  this->_vptr_ScalarOperation = (_func_int **)&PTR__ScalarOperation_00114428;
  ppMVar1 = (this->modules_).
            super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 !=
      (this->modules_).
      super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppMVar1 != (ModuleInterface *)0x0) {
        (*(*ppMVar1)->_vptr_ModuleInterface[1])();
      }
      ppMVar1 = ppMVar1 + 1;
    } while (ppMVar1 !=
             (this->modules_).
             super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppMVar1 = (this->modules_).
            super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppMVar1 != (pointer)0x0) {
    operator_delete(ppMVar1);
    return;
  }
  return;
}

Assistant:

virtual ~ScalarOperation() {
    for (std::vector<ScalarOperation::ModuleInterface*>::iterator itr(
             modules_.begin());
         itr != modules_.end(); ++itr) {
      delete (*itr);
    }
  }